

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::querySurfaceSupportTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkInstance instance;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  uint queueFamilyIndex;
  VkPhysicalDevice pVVar1;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  VkInstance_s **ppVVar2;
  Display *nativeDisplay;
  Window *nativeWindow;
  VkPhysicalDevice pVVar3;
  const_reference ppVVar4;
  Handle<(vk::HandleType)25> *pHVar5;
  MessageBuilder *pMVar6;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  char *local_4c8;
  MessageBuilder local_4c0;
  deUint64 local_340;
  VkBool32 local_334;
  uint local_330;
  VkBool32 isSupported;
  deUint32 queueFamilyNdx;
  deUint32 numQueueFamilies;
  VkPhysicalDevice physicalDevice;
  size_t deviceNdx;
  undefined1 local_310 [7];
  bool expectSupportedOnAll;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  RefData<vk::Handle<(vk::HandleType)25>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  undefined1 local_288 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector results;
  TestLog *log;
  Type wsiType_local;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,log_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8,context,wsiType,(VkAllocationCallbacks *)0x0);
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  NativeObjects::NativeObjects
            ((NativeObjects *)local_288,context,
             (Extensions *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe
            ((Maybe<tcu::Vector<unsigned_int,_2>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  instance = *ppVVar2;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_288);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)
             &physicalDevices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             instance,wsiType,nativeDisplay,nativeWindow,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2d8,
             (Move *)&physicalDevices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data.deleter.m_instanceIface = local_2d8.deleter.m_instanceIface;
  data.object.m_internal = local_2d8.object.m_internal;
  data.deleter.m_instance = local_2d8.deleter.m_instance;
  data.deleter.m_allocator = local_2d8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_2b8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)25>_> *)
             &physicalDevices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             local_310,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             *ppVVar2);
  deviceNdx._7_1_ = wsiType == TYPE_ANDROID;
  physicalDevice = (VkPhysicalDevice)0x0;
  while( true ) {
    pVVar1 = physicalDevice;
    pVVar3 = (VkPhysicalDevice)
             std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                       ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                         *)local_310);
    if (pVVar3 <= pVVar1) break;
    ppVVar4 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)local_310,(size_type)physicalDevice);
    _queueFamilyNdx = *ppVVar4;
    isSupported = getNumQueueFamilies((InstanceInterface *)
                                      &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.
                                       deleter.m_allocator,_queueFamilyNdx);
    for (local_330 = 0; pVVar1 = _queueFamilyNdx, queueFamilyIndex = local_330,
        local_330 < isSupported; local_330 = local_330 + 1) {
      pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_2b8);
      local_340 = pHVar5->m_internal;
      local_334 = ::vk::wsi::getPhysicalDeviceSurfaceSupport
                            ((InstanceInterface *)
                             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
                              m_allocator,pVVar1,queueFamilyIndex,(VkSurfaceKHR)local_340);
      tcu::TestLog::operator<<
                (&local_4c0,(TestLog *)results.m_message.field_2._8_8_,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_4c0,(char (*) [8])"Device ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(unsigned_long *)&physicalDevice);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])", queue family ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_330);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x13c7be4);
      local_4c8 = "";
      if (local_334 == 0) {
        local_4c8 = "NOT ";
      }
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4c8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])0x136b557);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4c0);
      if (((deviceNdx._7_1_ & 1) != 0) && (local_334 == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4e8,
                   "Surface must be supported by all devices and queue families",&local_4e9);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::allocator<char>::~allocator(&local_4e9);
      }
    }
    physicalDevice = physicalDevice + 1;
  }
  code = tcu::ResultCollector::getResult((ResultCollector *)local_78);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_510,(ResultCollector *)local_78);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             local_310);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_2b8);
  NativeObjects::~NativeObjects((NativeObjects *)local_288);
  InstanceHelper::~InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus querySurfaceSupportTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log						= context.getTestContext().getLog();
	tcu::ResultCollector			results					(log);

	const InstanceHelper			instHelper				(context, wsiType);
	const NativeObjects				native					(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>		surface					(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const vector<VkPhysicalDevice>	physicalDevices			= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);

	// On Android surface must be supported by all devices and queue families
	const bool						expectSupportedOnAll	= wsiType == TYPE_ANDROID;

	for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice		physicalDevice		= physicalDevices[deviceNdx];
		const deUint32				numQueueFamilies	= getNumQueueFamilies(instHelper.vki, physicalDevice);

		for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < numQueueFamilies; ++queueFamilyNdx)
		{
			const VkBool32	isSupported		= getPhysicalDeviceSurfaceSupport(instHelper.vki, physicalDevice, queueFamilyNdx, *surface);

			log << TestLog::Message << "Device " << deviceNdx << ", queue family " << queueFamilyNdx << ": "
									<< (isSupported == VK_FALSE ? "NOT " : "") << "supported"
				<< TestLog::EndMessage;

			if (expectSupportedOnAll && !isSupported)
				results.fail("Surface must be supported by all devices and queue families");
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}